

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.cpp
# Opt level: O0

void __thiscall Pathie::Tempfile::~Tempfile(Tempfile *this)

{
  Tempfile *this_local;
  
  (this->super_TempEntry)._vptr_TempEntry = (_func_int **)&PTR__Tempfile_0011dcd0;
  if (((this->super_TempEntry).m_keep & 1U) == 0) {
    (*(this->super_TempEntry)._vptr_TempEntry[2])();
  }
  TempEntry::~TempEntry(&this->super_TempEntry);
  return;
}

Assistant:

Tempfile::~Tempfile()
{
  if (!m_keep)
    remove();
}